

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O3

double __thiscall chrono::ChShaftsTorqueConverter::GetSpeedRatio(ChShaftsTorqueConverter *this)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  dVar1 = this->shaft_stator->pos_dt;
  dVar2 = this->shaft1->pos_dt - dVar1;
  dVar1 = this->shaft2->pos_dt - dVar1;
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar2;
  auVar5 = vandpd_avx(auVar5,auVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar6 = vandpd_avx(auVar6,auVar7);
  uVar3 = vcmpsd_avx512f(auVar6,ZEXT816(0x3e45798ee2308c3a),1);
  uVar4 = vcmpsd_avx512f(auVar5,ZEXT816(0x3e45798ee2308c3a),1);
  return (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 (ulong)!(bool)((byte)uVar3 & 1) * (long)(dVar1 / dVar2));
}

Assistant:

double ChShaftsTorqueConverter::GetSpeedRatio() const {
    double wrel1 = shaft1->GetPos_dt() - shaft_stator->GetPos_dt();
    double wrel2 = shaft2->GetPos_dt() - shaft_stator->GetPos_dt();

    if ((fabs(wrel1) < 10e-9) || (fabs(wrel2) < 10e-9))
        return 0;

    return wrel2 / wrel1;
}